

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O2

void __thiscall
fakeit::BoostTestAdapter::handle(BoostTestAdapter *this,SequenceVerificationEvent *evt)

{
  int line;
  string format;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38 [32];
  
  (*this->_formatter->_vptr_EventFormatter[1])(local_38,this->_formatter,evt);
  std::__cxx11::string::string((string *)&local_58,*(char **)(evt + 0x10),&local_79);
  line = *(int *)(evt + 0x18);
  std::__cxx11::string::string((string *)&local_78,local_38);
  boost_fail(this,&local_58,line,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

virtual void handle(const SequenceVerificationEvent &evt) override {
            std::string format = _formatter.format(evt);
            boost_fail(evt.file(), evt.line(), format);
        }